

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_enum_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::EnumFieldGenerator::GenerateMergeFromCodedStream
          (EnumFieldGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  uint32 uVar1;
  uint i;
  string sStack_38;
  
  variables = &this->variables_;
  io::Printer::Print(printer,variables,
                     "int value;\nDO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<\n         int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(\n       input, &value)));\n"
                    );
  if (*(int *)(*(long *)(this->descriptor_ + 0x30) + 0x8c) == 3) {
    io::Printer::Print(printer,variables,"set_$name$(static_cast< $type$ >(value));\n");
    return;
  }
  io::Printer::Print(printer,variables,
                     "if ($type$_IsValid(value)) {\n  set_$name$(static_cast< $type$ >(value));\n");
  if ((((this->super_FieldGenerator).options_)->enforce_lite == false) &&
     (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x30) + 0xa0) + 0xa8) != 3)) {
    io::Printer::Print(printer,variables,
                       "} else {\n  mutable_unknown_fields()->AddVarint($number$, value);\n");
  }
  else {
    uVar1 = internal::WireFormat::MakeTag(this->descriptor_);
    SimpleItoa_abi_cxx11_(&sStack_38,(protobuf *)(ulong)uVar1,i);
    io::Printer::Print(printer,
                       "} else {\n  unknown_fields_stream.WriteVarint32($tag$u);\n  unknown_fields_stream.WriteVarint32(value);\n"
                       ,"tag",&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  io::Printer::Print(printer,variables,"}\n");
  return;
}

Assistant:

void EnumFieldGenerator::
GenerateMergeFromCodedStream(io::Printer* printer) const {
  printer->Print(variables_,
    "int value;\n"
    "DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<\n"
    "         int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(\n"
    "       input, &value)));\n");
  if (HasPreservingUnknownEnumSemantics(descriptor_->file())) {
    printer->Print(variables_,
      "set_$name$(static_cast< $type$ >(value));\n");
  } else {
    printer->Print(variables_,
      "if ($type$_IsValid(value)) {\n"
      "  set_$name$(static_cast< $type$ >(value));\n");
    if (UseUnknownFieldSet(descriptor_->file(), options_)) {
      printer->Print(variables_,
        "} else {\n"
        "  mutable_unknown_fields()->AddVarint($number$, value);\n");
    } else {
      printer->Print(
        "} else {\n"
        "  unknown_fields_stream.WriteVarint32($tag$u);\n"
        "  unknown_fields_stream.WriteVarint32(value);\n",
        "tag", SimpleItoa(internal::WireFormat::MakeTag(descriptor_)));
    }
    printer->Print(variables_,
      "}\n");
  }
}